

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int check_mapping(saucy *s,int *adj,int *edg,int k)

{
  bool bVar1;
  int local_30;
  int ret;
  int gk;
  int i;
  int k_local;
  int *edg_local;
  int *adj_local;
  saucy *s_local;
  
  local_30 = 1;
  for (ret = adj[k]; ret != adj[k + 1]; ret = ret + 1) {
    s->stuff[s->gamma[edg[ret]]] = '\x01';
  }
  ret = adj[s->gamma[k]];
  while( true ) {
    bVar1 = false;
    if (local_30 != 0) {
      bVar1 = ret != adj[s->gamma[k] + 1];
    }
    if (!bVar1) break;
    local_30 = (int)s->stuff[edg[ret]];
    ret = ret + 1;
  }
  for (ret = adj[k]; ret != adj[k + 1]; ret = ret + 1) {
    s->stuff[s->gamma[edg[ret]]] = '\0';
  }
  return local_30;
}

Assistant:

static int
check_mapping(struct saucy *s, const int *adj, const int *edg, int k)
{
    int i, gk, ret = 1;

    /* Mark gamma of neighbors */
    for (i = adj[k]; i != adj[k+1]; ++i) {
        s->stuff[s->gamma[edg[i]]] = 1;
    }

    /* Check neighbors of gamma */
    gk = s->gamma[k];
    for (i = adj[gk]; ret && i != adj[gk+1]; ++i) {
        ret = s->stuff[edg[i]];
    }

    /* Clear out bit vector before we leave */
    for (i = adj[k]; i != adj[k+1]; ++i) {
        s->stuff[s->gamma[edg[i]]] = 0;
    }

    return ret;
}